

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::value::AssetPath>
          (AsciiParser *this,
          vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *result)

{
  AssetPath *__first;
  AssetPath *__last;
  bool bVar1;
  undefined8 in_RAX;
  byte unaff_BPL;
  char c;
  char local_21;
  
  local_21 = (char)((ulong)in_RAX >> 0x38);
  bVar1 = Expect(this,'[');
  if (bVar1) {
    bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
    if (bVar1) {
      bVar1 = Char1(this,&local_21);
      if (bVar1) {
        if (local_21 == ']') {
          __first = (result->
                    super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          __last = (result->
                   super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          unaff_BPL = 1;
          if (__last != __first) {
            ::std::_Destroy_aux<false>::__destroy<tinyusdz::value::AssetPath*>(__first,__last);
            (result->
            super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
            )._M_impl.super__Vector_impl_data._M_finish = __first;
          }
          goto LAB_004075ef;
        }
        Rewind(this,1);
        bVar1 = true;
      }
      else {
        unaff_BPL = 0;
LAB_004075ef:
        bVar1 = false;
      }
      if (!bVar1) goto LAB_00407643;
      bVar1 = SepBy1BasicType<tinyusdz::value::AssetPath>(this,',',']',result);
      if (bVar1) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (bVar1) {
          unaff_BPL = Expect(this,']');
          goto LAB_00407643;
        }
      }
    }
  }
  unaff_BPL = 0;
LAB_00407643:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<T> *result) {
  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType<T>(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }
  return true;
}